

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bpls.cpp
# Opt level: O1

void adios2::utils::mergeLists(int nV,char **listV,int nA,char **listA,char **mlist,bool *isVar)

{
  bool bVar1;
  bool bVar2;
  int iVar3;
  ulong uVar4;
  ulong uVar5;
  int iVar6;
  int iVar7;
  
  if (((sortnames == '\x01') && (listattrs == '\x01')) && (attrsonly == '\0')) {
    bVar1 = 0 < nV;
    bVar2 = 0 < nA;
    if (bVar1 || bVar2) {
      iVar7 = 0;
      iVar6 = 0;
      do {
        if ((!bVar2) || ((bVar1 && (iVar3 = strcmp(listV[iVar6],listA[iVar7]), iVar3 < 1)))) {
          mlist[iVar7 + iVar6] = listV[iVar6];
          isVar[iVar7 + iVar6] = true;
          iVar6 = iVar6 + 1;
        }
        else {
          mlist[iVar7 + iVar6] = listA[iVar7];
          isVar[iVar7 + iVar6] = false;
          iVar7 = iVar7 + 1;
        }
        bVar1 = iVar6 < nV;
        bVar2 = iVar7 < nA;
      } while (bVar1 || bVar2);
    }
  }
  else {
    uVar4 = 0;
    if ((0 < nV) && (attrsonly == '\0')) {
      uVar4 = 0;
      do {
        mlist[uVar4] = listV[uVar4];
        isVar[uVar4] = true;
        uVar4 = uVar4 + 1;
      } while ((uint)nV != uVar4);
    }
    if ((0 < nA) && (listattrs != '\0')) {
      uVar5 = 0;
      do {
        mlist[uVar4 + uVar5] = listA[uVar5];
        isVar[uVar5 + uVar4] = false;
        uVar5 = uVar5 + 1;
      } while ((uint)nA != uVar5);
    }
  }
  return;
}

Assistant:

void mergeLists(int nV, char **listV, int nA, char **listA, char **mlist, bool *isVar)
{
    int v, a, idx;
    if (sortnames && listattrs && !attrsonly)
    {
        // merge sort the two lists
        v = 0;
        a = 0;
        while (v < nV || a < nA)
        {
            if (a < nA && (v >= nV || strcmp(listV[v], listA[a]) > 0))
            {
                // fully consumed var list or
                // next item in attr list is less than next item in var list
                mlist[v + a] = listA[a];
                isVar[v + a] = false;
                a++;
            }
            else
            {
                mlist[v + a] = listV[v];
                isVar[v + a] = true;
                v++;
            }
        }
    }
    else
    {
        // first add vars then attrs (if ask ed)
        idx = 0;
        if (!attrsonly)
        {
            for (v = 0; v < nV; v++)
            {
                mlist[idx] = listV[v];
                isVar[idx] = true;
                idx++;
            }
        }
        if (listattrs)
        {
            for (a = 0; a < nA; a++)
            {
                mlist[idx] = listA[a];
                isVar[idx] = false;
                idx++;
            }
        }
    }
}